

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,UnknownFieldSet *other)

{
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_local;
  InternalMetadata *this_local;
  
  this_00 = mutable_unknown_fields<google::protobuf::UnknownFieldSet>(this);
  UnknownFieldSet::MergeFrom(this_00,other);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DoMergeFrom(const T& other) {
    mutable_unknown_fields<T>()->MergeFrom(other);
  }